

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::detail::ContextState::finalizeTestCaseData(ContextState *this)

{
  int *piVar1;
  uint *puVar2;
  int iVar3;
  TestCase *pTVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  Approx local_58;
  Approx local_38;
  
  dVar5 = Timer::getElapsedSeconds(&this->timer);
  (this->super_CurrentTestCaseStats).seconds = dVar5;
  iVar7 = MultiLaneAtomic::operator_cast_to_int(&this->numAssertsCurrentTest_atomic);
  piVar1 = &(this->super_TestRunStats).numAsserts;
  *piVar1 = *piVar1 + iVar7;
  iVar7 = MultiLaneAtomic::operator_cast_to_int(&this->numAssertsFailedCurrentTest_atomic);
  piVar1 = &(this->super_TestRunStats).numAssertsFailed;
  *piVar1 = *piVar1 + iVar7;
  iVar7 = MultiLaneAtomic::operator_cast_to_int(&this->numAssertsCurrentTest_atomic);
  (this->super_CurrentTestCaseStats).numAssertsCurrentTest = iVar7;
  iVar7 = MultiLaneAtomic::operator_cast_to_int(&this->numAssertsFailedCurrentTest_atomic);
  (this->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = iVar7;
  if (iVar7 != 0) {
    piVar1 = &(this->super_CurrentTestCaseStats).failure_flags;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  pTVar4 = (this->super_ContextOptions).currentTest;
  dVar5 = (pTVar4->super_TestCaseData).m_timeout;
  local_38.m_epsilon = 2.220446049250313e-16;
  local_38.m_scale = 1.0;
  local_38.m_value = dVar5;
  bVar6 = operator!=(&local_38,0.0);
  if (bVar6) {
    local_58.m_value = (this->super_CurrentTestCaseStats).seconds;
    local_58.m_epsilon = 2.220446049250313e-16;
    local_58.m_scale = 1.0;
    bVar6 = operator>(&local_58,dVar5);
    if (bVar6) {
      piVar1 = &(this->super_CurrentTestCaseStats).failure_flags;
      *(byte *)piVar1 = (byte)*piVar1 | 0x10;
    }
  }
  uVar8 = (this->super_CurrentTestCaseStats).failure_flags;
  if ((pTVar4->super_TestCaseData).m_should_fail == true) {
    uVar9 = uVar8 | 0x40;
    bVar6 = uVar8 != 0;
    uVar8 = 0x20;
    if (bVar6) {
      uVar8 = uVar9;
    }
  }
  else if ((uVar8 == 0) || ((pTVar4->super_TestCaseData).m_may_fail != true)) {
    iVar3 = (pTVar4->super_TestCaseData).m_expected_failures;
    if (iVar3 < 1) goto LAB_00116062;
    if (iVar7 == iVar3) {
      uVar8 = uVar8 | 0x100;
    }
    else {
      uVar8 = uVar8 | 0x80;
    }
  }
  else {
    uVar8 = uVar8 | 0x200;
  }
  (this->super_CurrentTestCaseStats).failure_flags = uVar8;
LAB_00116062:
  bVar6 = (uVar8 & 0x340) != 0;
  (this->super_CurrentTestCaseStats).testCaseSuccess = uVar8 == 0 || bVar6;
  if (uVar8 != 0 && !bVar6) {
    puVar2 = &(this->super_TestRunStats).numTestCasesFailed;
    *puVar2 = *puVar2 + 1;
  }
  return;
}

Assistant:

void finalizeTestCaseData() {
            seconds = timer.getElapsedSeconds();

            // update the non-atomic counters
            numAsserts += numAssertsCurrentTest_atomic;
            numAssertsFailed += numAssertsFailedCurrentTest_atomic;
            numAssertsCurrentTest       = numAssertsCurrentTest_atomic;
            numAssertsFailedCurrentTest = numAssertsFailedCurrentTest_atomic;

            if(numAssertsFailedCurrentTest)
                failure_flags |= TestCaseFailureReason::AssertFailure;

            if(Approx(currentTest->m_timeout).epsilon(DBL_EPSILON) != 0 &&
               Approx(seconds).epsilon(DBL_EPSILON) > currentTest->m_timeout)
                failure_flags |= TestCaseFailureReason::Timeout;

            if(currentTest->m_should_fail) {
                if(failure_flags) {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedAndDid;
                } else {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedButDidnt;
                }
            } else if(failure_flags && currentTest->m_may_fail) {
                failure_flags |= TestCaseFailureReason::CouldHaveFailedAndDid;
            } else if(currentTest->m_expected_failures > 0) {
                if(numAssertsFailedCurrentTest == currentTest->m_expected_failures) {
                    failure_flags |= TestCaseFailureReason::FailedExactlyNumTimes;
                } else {
                    failure_flags |= TestCaseFailureReason::DidntFailExactlyNumTimes;
                }
            }

            bool ok_to_fail = (TestCaseFailureReason::ShouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::CouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::FailedExactlyNumTimes & failure_flags);

            // if any subcase has failed - the whole test case has failed
            testCaseSuccess = !(failure_flags && !ok_to_fail);
            if(!testCaseSuccess)
                numTestCasesFailed++;
        }